

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPublicKey.cpp
# Opt level: O0

ByteString * __thiscall DSAPublicKey::serialise(DSAPublicKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffff00;
  ByteString *in_stack_ffffffffffffff08;
  ByteString *in_stack_ffffffffffffff28;
  
  ByteString::serialise(in_stack_ffffffffffffff28);
  ByteString::serialise(in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ByteString::serialise(in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ByteString::serialise(in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ByteString::~ByteString((ByteString *)0x14ef8a);
  ByteString::~ByteString((ByteString *)0x14ef97);
  ByteString::~ByteString((ByteString *)0x14efa1);
  ByteString::~ByteString((ByteString *)0x14efae);
  ByteString::~ByteString((ByteString *)0x14efb8);
  ByteString::~ByteString((ByteString *)0x14efc5);
  return in_RDI;
}

Assistant:

ByteString DSAPublicKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       g.serialise() +
	       y.serialise();
}